

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIEnvironment::drawAll(CGUIEnvironment *this,bool useScreenSize)

{
  int iVar1;
  int iVar2;
  u32 uVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  rect<int> local_18;
  
  if (((int)CONCAT71(in_register_00000031,useScreenSize) != 0) &&
     (this->Driver != (IVideoDriver *)0x0)) {
    iVar2 = (*this->Driver->_vptr_IVideoDriver[0x3b])();
    iVar1 = *(int *)CONCAT44(extraout_var,iVar2);
    iVar2 = ((int *)CONCAT44(extraout_var,iVar2))[1];
    if ((*(int *)&this->field_0x50 != iVar1) ||
       (((*(int *)&this->field_0x48 != 0 || (*(int *)&this->field_0x54 != iVar2)) ||
        (*(int *)&this->field_0x4c != 0)))) {
      local_18.UpperLeftCorner.X = 0;
      local_18.UpperLeftCorner.Y = 0;
      local_18.LowerRightCorner.X = iVar1;
      local_18.LowerRightCorner.Y = iVar2;
      IGUIElement::setRelativePosition
                ((IGUIElement *)&(this->super_IGUIEnvironment).field_0x8,&local_18);
    }
  }
  if ((this->ToolTip).Element != (IGUIStaticText *)0x0) {
    (**(code **)(*(long *)&(this->super_IGUIEnvironment).field_0x8 + 0xd0))
              (&(this->super_IGUIEnvironment).field_0x8);
  }
  (**(code **)(*(long *)&(this->super_IGUIEnvironment).field_0x8 + 0x50))
            (&(this->super_IGUIEnvironment).field_0x8);
  uVar3 = os::Timer::getTime();
  (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x2a])(this,(ulong)uVar3);
  clearDeletionQueue(this);
  return;
}

Assistant:

void CGUIEnvironment::drawAll(bool useScreenSize)
{
	if (useScreenSize && Driver) {
		core::dimension2d<s32> dim(Driver->getScreenSize());
		if (AbsoluteRect.LowerRightCorner.X != dim.Width ||
				AbsoluteRect.UpperLeftCorner.X != 0 ||
				AbsoluteRect.LowerRightCorner.Y != dim.Height ||
				AbsoluteRect.UpperLeftCorner.Y != 0) {
			setRelativePosition(core::recti(0, 0, dim.Width, dim.Height));
		}
	}

	// make sure tooltip is always on top
	if (ToolTip.Element)
		bringToFront(ToolTip.Element);

	draw();
	OnPostRender(os::Timer::getTime());

	clearDeletionQueue();
}